

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_branch(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  target_ulong_conflict tVar1;
  TCGContext_conflict2 *s_00;
  uint16_t uVar2;
  uint32_t uVar3;
  TCGv_i32 val;
  TCGLabel *l1;
  int iVar4;
  uint uVar5;
  
  s_00 = s->uc->tcg_ctx;
  tVar1 = s->pc;
  uVar5 = (byte)(insn >> 8) & 0xf;
  iVar4 = (uint)insn * 0x1000000;
  if (iVar4 == 0) {
    uVar2 = read_im16(env,s);
    uVar3 = (uint32_t)(short)uVar2;
  }
  else if (iVar4 == -0x1000000) {
    uVar3 = read_im32(env,s);
  }
  else {
    uVar3 = iVar4 >> 0x18;
  }
  if ((short)uVar5 != 0) {
    if (uVar5 != 1) {
      l1 = gen_new_label_m68k(s_00);
      gen_jmpcc(s,uVar5 ^ 1,l1);
      gen_jmp_tb(s,1,uVar3 + tVar1);
      gen_set_label(s_00,l1);
      uVar3 = s->pc;
      goto LAB_006789a9;
    }
    val = tcg_const_i32_m68k(s_00,s->pc);
    gen_push(s,val);
  }
  update_cc_op(s);
  uVar3 = uVar3 + tVar1;
LAB_006789a9:
  gen_jmp_tb(s,0,uVar3);
  return;
}

Assistant:

DISAS_INSN(branch)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int32_t offset;
    uint32_t base;
    int op;

    base = s->pc;
    op = (insn >> 8) & 0xf;
    offset = (int8_t)insn;
    if (offset == 0) {
        offset = (int16_t)read_im16(env, s);
    } else if (offset == -1) {
        offset = read_im32(env, s);
    }
    if (op == 1) {
        /* bsr */
        gen_push(s, tcg_const_i32(tcg_ctx, s->pc));
    }
    if (op > 1) {
        /* Bcc */
        TCGLabel *l1 = gen_new_label(tcg_ctx);
        gen_jmpcc(s, ((insn >> 8) & 0xf) ^ 1, l1);
        gen_jmp_tb(s, 1, base + offset);
        gen_set_label(tcg_ctx, l1);
        gen_jmp_tb(s, 0, s->pc);
    } else {
        /* Unconditional branch.  */
        update_cc_op(s);
        gen_jmp_tb(s, 0, base + offset);
    }
}